

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
           (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
            begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  end,anon_class_8_1_898a9ca8 comp)

{
  bool bVar1;
  reference pCVar2;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  *p_Var3;
  reference pCVar4;
  CliqueVar *in_RSI;
  CliqueVar *in_RDI;
  pair<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>,_bool>
  pVar5;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  pivot_pos;
  bool already_partitioned;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  last;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  first;
  T pivot;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_90;
  CliqueVar local_88;
  CliqueVar local_84;
  CliqueVar local_80;
  CliqueVar local_7c;
  CliqueVar *local_70;
  undefined1 local_61;
  CliqueVar local_60;
  CliqueVar local_5c;
  CliqueVar local_58;
  CliqueVar local_54;
  CliqueVar *local_50;
  CliqueVar CVar6;
  CliqueVar CVar7;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var8;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_38;
  CliqueVar local_2c;
  CliqueVar *local_20;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_18 [3];
  
  local_20 = in_RSI;
  local_18[0]._M_current = in_RDI;
  pCVar2 = __gnu_cxx::
           __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
           ::operator*(local_18);
  local_2c = *pCVar2;
  local_38._M_current = local_18[0]._M_current;
  _Var8._M_current = local_20;
  do {
    p_Var3 = __gnu_cxx::
             __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
             ::operator++(&local_38);
    pCVar2 = __gnu_cxx::
             __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
             ::operator*(p_Var3);
    CVar7 = *pCVar2;
    CVar6 = local_2c;
    bVar1 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                      ((anon_class_8_1_898a9ca8 *)CONCAT44(CVar7,local_2c),
                       SUB84((ulong)_Var8._M_current >> 0x20,0),SUB84(_Var8._M_current,0));
  } while (bVar1);
  local_50 = (CliqueVar *)
             __gnu_cxx::
             __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
             ::operator-((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff50._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      *)in_stack_ffffffffffffff50._M_current,
                     (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      *)in_stack_ffffffffffffff48._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_ffffffffffffff50._M_current,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_ffffffffffffff48._M_current);
      in_stack_ffffffffffffff5f = 0;
      if (bVar1) {
        p_Var3 = __gnu_cxx::
                 __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator--((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)&stack0xffffffffffffffc0);
        pCVar2 = __gnu_cxx::
                 __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator*(p_Var3);
        local_54 = *pCVar2;
        local_58 = local_2c;
        bVar1 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                          ((anon_class_8_1_898a9ca8 *)CONCAT44(CVar7,CVar6),
                           SUB84((ulong)_Var8._M_current >> 0x20,0),SUB84(_Var8._M_current,0));
        in_stack_ffffffffffffff5f = bVar1 ^ 0xff;
      }
    } while ((in_stack_ffffffffffffff5f & 1) != 0);
  }
  else {
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator--((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                             *)&stack0xffffffffffffffc0);
      pCVar2 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(p_Var3);
      local_5c = *pCVar2;
      local_60 = local_2c;
      bVar1 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                        ((anon_class_8_1_898a9ca8 *)CONCAT44(CVar7,CVar6),
                         SUB84((ulong)_Var8._M_current >> 0x20,0),SUB84(_Var8._M_current,0));
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_61 = __gnu_cxx::operator>=
                       ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                         *)in_stack_ffffffffffffff50._M_current,
                        (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                         *)in_stack_ffffffffffffff48._M_current);
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                             *)in_stack_ffffffffffffff50._M_current,
                            (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                             *)in_stack_ffffffffffffff48._M_current), bVar1) {
    local_70 = local_38._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator++(&local_38);
      pCVar2 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(p_Var3);
      local_7c = *pCVar2;
      local_80 = local_2c;
      bVar1 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                        ((anon_class_8_1_898a9ca8 *)CONCAT44(CVar7,CVar6),
                         SUB84((ulong)_Var8._M_current >> 0x20,0),SUB84(_Var8._M_current,0));
    } while (bVar1);
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator--((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                             *)&stack0xffffffffffffffc0);
      pCVar2 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(p_Var3);
      local_84 = *pCVar2;
      local_88 = local_2c;
      bVar1 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                        ((anon_class_8_1_898a9ca8 *)CONCAT44(CVar7,CVar6),
                         SUB84((ulong)_Var8._M_current >> 0x20,0),SUB84(_Var8._M_current,0));
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_90 = __gnu_cxx::
             __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
             ::operator-((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff50._M_current);
  p_Var3 = &local_90;
  pCVar2 = __gnu_cxx::
           __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
           ::operator*(p_Var3);
  pCVar4 = __gnu_cxx::
           __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
           ::operator*(local_18);
  *pCVar4 = *pCVar2;
  pCVar4 = __gnu_cxx::
           __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
           ::operator*(p_Var3);
  *pCVar4 = local_2c;
  pVar5 = std::
          make_pair<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>&,bool&>
                    (p_Var3,(bool *)pCVar2);
  return pVar5;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }